

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O0

void __thiscall CompoundFile::Header::Header(Header *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  SecID::SecID((SecID *)(in_RDI + 4),0);
  in_RDI[5] = 0;
  SecID::SecID((SecID *)(in_RDI + 6),0);
  in_RDI[7] = 0;
  SecID::SecID((SecID *)(in_RDI + 8),0);
  in_RDI[9] = 0;
  return;
}

Assistant:

inline
Header::Header()
	:	m_byteOrder( Excel::Stream::LittleEndian )
	,	m_sectorSize( 0 )
	,	m_shortSectorSize( 0 )
	,	m_sectorsInSAT( 0 )
	,	m_dirStreamSecID( 0 )
	,	m_streamMinSize( 0 )
	,	m_ssatFirstSecID( 0 )
	,	m_sectorsInSSAT( 0 )
	,	m_msatFirstSecID( 0 )
	,	m_sectorsInMSAT( 0 )
{
}